

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O1

int parse_switches(j_compress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,boolean for_real
                  )

{
  int *piVar1;
  boolean bVar2;
  int iVar3;
  char *filename;
  int iVar4;
  J_COLOR_SPACE colorspace;
  char *arg;
  char *pcVar5;
  char *filename_00;
  bool bVar6;
  char ch;
  long lval;
  byte local_71;
  j_compress_ptr local_70;
  ulong local_68;
  int local_5c;
  undefined8 local_58;
  char *local_50;
  int local_44;
  char *local_40;
  char *local_38;
  
  is_targa = 0;
  icc_filename = (char *)0x0;
  outfilename = (char *)0x0;
  memdst = 0;
  report = 0;
  cinfo->err->trace_level = 0;
  local_70 = cinfo;
  local_44 = last_file_arg_seen;
  if (1 < argc) {
    iVar4 = 1;
    local_38 = (char *)0x0;
    local_40 = (char *)0x0;
    local_50 = (char *)0x0;
    filename = (char *)0x0;
    arg = (char *)0x0;
    local_5c = 0;
    local_58 = 0;
LAB_00105a7f:
    if (*argv[iVar4] == '-') {
      pcVar5 = argv[iVar4] + 1;
      bVar2 = keymatch(pcVar5,"arithmetic",1);
      if (bVar2 == 0) {
        bVar2 = keymatch(pcVar5,"baseline",1);
        if (bVar2 == 0) {
          bVar2 = keymatch(pcVar5,"dct",2);
          if (bVar2 == 0) {
            bVar2 = keymatch(pcVar5,"debug",1);
            if ((bVar2 == 0) && (bVar2 = keymatch(pcVar5,"verbose",1), bVar2 == 0)) {
              bVar2 = keymatch(pcVar5,"version",4);
              if (bVar2 != 0) goto LAB_0010612c;
              bVar2 = keymatch(pcVar5,"grayscale",2);
              if ((bVar2 == 0) && (bVar2 = keymatch(pcVar5,"greyscale",2), bVar2 == 0)) {
                bVar2 = keymatch(pcVar5,"rgb",3);
                if (bVar2 == 0) {
                  bVar2 = keymatch(pcVar5,"icc",1);
                  if (bVar2 == 0) {
                    bVar2 = keymatch(pcVar5,"maxmemory",3);
                    if (bVar2 == 0) {
                      bVar2 = keymatch(pcVar5,"optimize",1);
                      if ((bVar2 == 0) && (bVar2 = keymatch(pcVar5,"optimise",1), bVar2 == 0)) {
                        bVar2 = keymatch(pcVar5,"outfile",4);
                        if (bVar2 == 0) {
                          bVar2 = keymatch(pcVar5,"progressive",1);
                          if (bVar2 != 0) {
                            local_5c = 1;
                            goto LAB_00105acb;
                          }
                          bVar2 = keymatch(pcVar5,"memdst",2);
                          if (bVar2 == 0) {
                            bVar2 = keymatch(pcVar5,"quality",1);
                            if (bVar2 == 0) {
                              bVar2 = keymatch(pcVar5,"qslots",2);
                              if (bVar2 == 0) {
                                bVar2 = keymatch(pcVar5,"qtables",2);
                                if (bVar2 == 0) {
                                  bVar2 = keymatch(pcVar5,"report",3);
                                  if (bVar2 == 0) {
                                    bVar2 = keymatch(pcVar5,"restart",1);
                                    if (bVar2 == 0) {
                                      bVar2 = keymatch(pcVar5,"sample",2);
                                      if (bVar2 == 0) {
                                        bVar2 = keymatch(pcVar5,"scans",4);
                                        if (bVar2 == 0) {
                                          bVar2 = keymatch(pcVar5,"smooth",2);
                                          if (bVar2 == 0) {
                                            bVar2 = keymatch(pcVar5,"targa",1);
                                            if (bVar2 == 0) goto LAB_00106127;
                                            is_targa = 1;
                                          }
                                          else {
                                            iVar4 = iVar4 + 1;
                                            if (((argc <= iVar4) ||
                                                (iVar3 = __isoc99_sscanf(argv[iVar4],"%d",&local_68)
                                                , iVar3 != 1)) || (100 < (uint)local_68))
                                            goto LAB_00106127;
                                            local_70->smoothing_factor = (uint)local_68;
                                          }
                                        }
                                        else {
                                          iVar4 = iVar4 + 1;
                                          if (argc <= iVar4) goto LAB_00106127;
                                          local_38 = argv[iVar4];
                                        }
                                      }
                                      else {
                                        iVar4 = iVar4 + 1;
                                        if (argc <= iVar4) goto LAB_00106127;
                                        local_40 = argv[iVar4];
                                      }
                                    }
                                    else {
                                      local_71 = 0x78;
                                      iVar4 = iVar4 + 1;
                                      if (((argc <= iVar4) ||
                                          (iVar3 = __isoc99_sscanf(argv[iVar4],"%ld%c",&local_68,
                                                                   &local_71), iVar3 < 1)) ||
                                         (0xffff < local_68)) goto LAB_00106127;
                                      if ((local_71 & 0xdf) == 0x42) {
                                        local_70->restart_interval = (uint)local_68;
                                        local_70->restart_in_rows = 0;
                                      }
                                      else {
                                        local_70->restart_in_rows = (uint)local_68;
                                      }
                                    }
                                  }
                                  else {
                                    report = 1;
                                  }
                                }
                                else {
                                  iVar4 = iVar4 + 1;
                                  if (argc <= iVar4) goto LAB_00106127;
                                  filename = argv[iVar4];
                                }
                              }
                              else {
                                iVar4 = iVar4 + 1;
                                if (argc <= iVar4) goto LAB_00106127;
                                local_50 = argv[iVar4];
                              }
                            }
                            else {
                              iVar4 = iVar4 + 1;
                              if (argc <= iVar4) goto LAB_00106127;
                              arg = argv[iVar4];
                            }
                          }
                          else {
                            memdst = 1;
                          }
                        }
                        else {
                          iVar4 = iVar4 + 1;
                          if (argc <= iVar4) goto LAB_00106127;
                          outfilename = argv[iVar4];
                        }
                      }
                      else {
                        local_70->optimize_coding = 1;
                      }
                    }
                    else {
                      local_71 = 0x78;
                      iVar4 = iVar4 + 1;
                      if ((argc <= iVar4) ||
                         (iVar3 = __isoc99_sscanf(argv[iVar4],"%ld%c",&local_68,&local_71),
                         iVar3 < 1)) goto LAB_00106127;
                      if ((local_71 & 0xdf) == 0x4d) {
                        local_68 = local_68 * 1000;
                      }
                      local_70->mem->max_memory_to_use = local_68 * 1000;
                    }
                  }
                  else {
                    iVar4 = iVar4 + 1;
                    if (argc <= iVar4) goto LAB_00106127;
                    icc_filename = argv[iVar4];
                  }
                  goto LAB_00105acb;
                }
                colorspace = JCS_RGB;
              }
              else {
                colorspace = JCS_GRAYSCALE;
              }
              jpeg_set_colorspace(local_70,colorspace);
            }
            else {
              if (parse_switches_printed_version == '\0') {
                parse_switches_cold_1();
              }
              piVar1 = &local_70->err->trace_level;
              *piVar1 = *piVar1 + 1;
            }
          }
          else {
            iVar4 = iVar4 + 1;
            if (argc <= iVar4) goto LAB_00106127;
            bVar2 = keymatch(argv[iVar4],"int",1);
            if (bVar2 == 0) {
              bVar2 = keymatch(argv[iVar4],"fast",2);
              if (bVar2 == 0) {
                bVar2 = keymatch(argv[iVar4],"float",2);
                if (bVar2 == 0) goto LAB_00106127;
                local_70->dct_method = JDCT_FLOAT;
              }
              else {
                local_70->dct_method = JDCT_IFAST;
              }
            }
            else {
              local_70->dct_method = JDCT_ISLOW;
            }
          }
        }
        else {
          local_58 = 1;
        }
      }
      else {
        local_70->arith_code = 1;
      }
    }
    else {
      if (0 < iVar4) goto LAB_0010606f;
      outfilename = (char *)0x0;
    }
LAB_00105acb:
    iVar4 = iVar4 + 1;
    if (argc <= iVar4) goto LAB_0010606f;
    goto LAB_00105a7f;
  }
  local_58 = 0;
  bVar6 = true;
  iVar4 = 1;
  arg = (char *)0x0;
  filename = (char *)0x0;
  local_50 = (char *)0x0;
  pcVar5 = (char *)0x0;
  filename_00 = (char *)0x0;
  goto LAB_00106082;
LAB_0010606f:
  bVar6 = local_5c == 0;
  pcVar5 = local_40;
  filename_00 = local_38;
LAB_00106082:
  if (local_44 == 0) {
    return iVar4;
  }
  if ((((arg == (char *)0x0) ||
       (bVar2 = set_quality_ratings(local_70,arg,(boolean)local_58), bVar2 != 0)) &&
      (((filename == (char *)0x0 ||
        (bVar2 = read_quant_tables(local_70,filename,(boolean)local_58), bVar2 != 0)) &&
       ((local_50 == (char *)0x0 || (bVar2 = set_quant_slots(local_70,local_50), bVar2 != 0)))))) &&
     ((pcVar5 == (char *)0x0 || (bVar2 = set_sample_factors(local_70,pcVar5), bVar2 != 0)))) {
    if (!bVar6) {
      jpeg_simple_progression(local_70);
    }
    if (filename_00 == (char *)0x0) {
      return iVar4;
    }
    bVar2 = read_scan_script(local_70,filename_00);
    if (bVar2 != 0) {
      return iVar4;
    }
  }
LAB_00106127:
  usage();
LAB_0010612c:
  parse_switches_cold_2();
  fprintf(_stderr,"usage: %s [switches] ",progname);
  fwrite("[inputfile]\n",0xc,1,_stderr);
  fwrite("Switches (names may be abbreviated):\n",0x25,1,_stderr);
  fwrite("  -quality N[,...]   Compression quality (0..100; 5-95 is most useful range,\n",0x4d,1,
         _stderr);
  fwrite("                     default is 75)\n",0x24,1,_stderr);
  fwrite("  -grayscale     Create monochrome JPEG file\n",0x2d,1,_stderr);
  fwrite("  -rgb           Create RGB JPEG file\n",0x26,1,_stderr);
  fwrite("  -optimize      Optimize Huffman table (smaller file, but slow compression)\n",0x4d,1,
         _stderr);
  fwrite("  -progressive   Create progressive JPEG file\n",0x2e,1,_stderr);
  fwrite("  -targa         Input file is Targa format (usually not needed)\n",0x41,1,_stderr);
  fwrite("Switches for advanced users:\n",0x1d,1,_stderr);
  fwrite("  -arithmetic    Use arithmetic coding\n",0x27,1,_stderr);
  fprintf(_stderr,"  -dct int       Use accurate integer DCT method%s\n"," (default)");
  fprintf(_stderr,"  -dct fast      Use less accurate integer DCT method [legacy feature]%s\n","");
  fprintf(_stderr,"  -dct float     Use floating-point DCT method [legacy feature]%s\n","");
  fwrite("  -icc FILE      Embed ICC profile contained in FILE\n",0x35,1,_stderr);
  fwrite("  -restart N     Set restart interval in rows, or in blocks with B\n",0x43,1,_stderr);
  fwrite("  -smooth N      Smooth dithered input (N=1..100 is strength)\n",0x3e,1,_stderr);
  fwrite("  -maxmemory N   Maximum memory to use (in kbytes)\n",0x33,1,_stderr);
  fwrite("  -outfile name  Specify name for output file\n",0x2e,1,_stderr);
  fwrite("  -memdst        Compress to memory instead of file (useful for benchmarking)\n",0x4e,1,
         _stderr);
  fwrite("  -report        Report compression progress\n",0x2d,1,_stderr);
  fwrite("  -verbose  or  -debug   Emit debug output\n",0x2b,1,_stderr);
  fwrite("  -version       Print version information and exit\n",0x34,1,_stderr);
  fwrite("Switches for wizards:\n",0x16,1,_stderr);
  fwrite("  -baseline      Force baseline quantization tables\n",0x34,1,_stderr);
  fwrite("  -qtables FILE  Use quantization tables given in FILE\n",0x37,1,_stderr);
  fwrite("  -qslots N[,...]    Set component quantization tables\n",0x37,1,_stderr);
  fwrite("  -sample HxV[,...]  Set component sampling factors\n",0x34,1,_stderr);
  fwrite("  -scans FILE    Create multi-scan JPEG per script FILE\n",0x38,1,_stderr);
  exit(1);
}

Assistant:

LOCAL(int)
parse_switches(j_compress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;
  boolean force_baseline;
  boolean simple_progressive;
  char *qualityarg = NULL;      /* saves -quality parm if any */
  char *qtablefile = NULL;      /* saves -qtables filename if any */
  char *qslotsarg = NULL;       /* saves -qslots parm if any */
  char *samplearg = NULL;       /* saves -sample parm if any */
  char *scansarg = NULL;        /* saves -scans parm if any */

  /* Set up default JPEG parameters. */

  force_baseline = FALSE;       /* by default, allow 16-bit quantizers */
  simple_progressive = FALSE;
  is_targa = FALSE;
  icc_filename = NULL;
  outfilename = NULL;
  memdst = FALSE;
  report = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "arithmetic", 1)) {
      /* Use arithmetic coding. */
#ifdef C_ARITH_CODING_SUPPORTED
      cinfo->arith_code = TRUE;
#else
      fprintf(stderr, "%s: sorry, arithmetic coding not supported\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "baseline", 1)) {
      /* Force baseline-compatible output (8-bit quantizer values). */
      force_baseline = TRUE;

    } else if (keymatch(arg, "dct", 2)) {
      /* Select DCT algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "int", 1)) {
        cinfo->dct_method = JDCT_ISLOW;
      } else if (keymatch(argv[argn], "fast", 2)) {
        cinfo->dct_method = JDCT_IFAST;
      } else if (keymatch(argv[argn], "float", 2)) {
        cinfo->dct_method = JDCT_FLOAT;
      } else
        usage();

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "grayscale", 2) ||
               keymatch(arg, "greyscale", 2)) {
      /* Force a monochrome JPEG file to be generated. */
      jpeg_set_colorspace(cinfo, JCS_GRAYSCALE);

    } else if (keymatch(arg, "rgb", 3)) {
      /* Force an RGB JPEG file to be generated. */
      jpeg_set_colorspace(cinfo, JCS_RGB);

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "optimize", 1) || keymatch(arg, "optimise", 1)) {
      /* Enable entropy parm optimization. */
#ifdef ENTROPY_OPT_SUPPORTED
      cinfo->optimize_coding = TRUE;
#else
      fprintf(stderr, "%s: sorry, entropy optimization was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "progressive", 1)) {
      /* Select simple progressive mode. */
#ifdef C_PROGRESSIVE_SUPPORTED
      simple_progressive = TRUE;
      /* We must postpone execution until num_components is known. */
#else
      fprintf(stderr, "%s: sorry, progressive output was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "memdst", 2)) {
      /* Use in-memory destination manager */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
      memdst = TRUE;
#else
      fprintf(stderr, "%s: sorry, in-memory destination manager was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "quality", 1)) {
      /* Quality ratings (quantization table scaling factors). */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qualityarg = argv[argn];

    } else if (keymatch(arg, "qslots", 2)) {
      /* Quantization table slot numbers. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qslotsarg = argv[argn];
      /* Must delay setting qslots until after we have processed any
       * colorspace-determining switches, since jpeg_set_colorspace sets
       * default quant table numbers.
       */

    } else if (keymatch(arg, "qtables", 2)) {
      /* Quantization tables fetched from file. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qtablefile = argv[argn];
      /* We postpone actually reading the file in case -quality comes later. */

    } else if (keymatch(arg, "report", 3)) {
      report = TRUE;

    } else if (keymatch(arg, "restart", 1)) {
      /* Restart interval in MCU rows (or in MCUs with 'b'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (lval < 0 || lval > 65535L)
        usage();
      if (ch == 'b' || ch == 'B') {
        cinfo->restart_interval = (unsigned int)lval;
        cinfo->restart_in_rows = 0; /* else prior '-restart n' overrides me */
      } else {
        cinfo->restart_in_rows = (int)lval;
        /* restart_interval will be computed during startup */
      }

    } else if (keymatch(arg, "sample", 2)) {
      /* Set sampling factors. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      samplearg = argv[argn];
      /* Must delay setting sample factors until after we have processed any
       * colorspace-determining switches, since jpeg_set_colorspace sets
       * default sampling factors.
       */

    } else if (keymatch(arg, "scans", 4)) {
      /* Set scan script. */
#ifdef C_MULTISCAN_FILES_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      scansarg = argv[argn];
      /* We must postpone reading the file in case -progressive appears. */
#else
      fprintf(stderr, "%s: sorry, multi-scan output was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "smooth", 2)) {
      /* Set input smoothing factor. */
      int val;

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%d", &val) != 1)
        usage();
      if (val < 0 || val > 100)
        usage();
      cinfo->smoothing_factor = val;

    } else if (keymatch(arg, "targa", 1)) {
      /* Input file is Targa format. */
      is_targa = TRUE;

    } else {
      usage();                  /* bogus switch */
    }
  }

  /* Post-switch-scanning cleanup */

  if (for_real) {

    /* Set quantization tables for selected quality. */
    /* Some or all may be overridden if -qtables is present. */
    if (qualityarg != NULL)     /* process -quality if it was present */
      if (!set_quality_ratings(cinfo, qualityarg, force_baseline))
        usage();

    if (qtablefile != NULL)     /* process -qtables if it was present */
      if (!read_quant_tables(cinfo, qtablefile, force_baseline))
        usage();

    if (qslotsarg != NULL)      /* process -qslots if it was present */
      if (!set_quant_slots(cinfo, qslotsarg))
        usage();

    if (samplearg != NULL)      /* process -sample if it was present */
      if (!set_sample_factors(cinfo, samplearg))
        usage();

#ifdef C_PROGRESSIVE_SUPPORTED
    if (simple_progressive)     /* process -progressive; -scans can override */
      jpeg_simple_progression(cinfo);
#endif

#ifdef C_MULTISCAN_FILES_SUPPORTED
    if (scansarg != NULL)       /* process -scans if it was present */
      if (!read_scan_script(cinfo, scansarg))
        usage();
#endif
  }

  return argn;                  /* return index of next arg (file name) */
}